

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_read_format_zip.c
# Opt level: O1

void verify_contents(archive *a,int seeking,int improved_streaming)

{
  uint uVar1;
  archive *paVar2;
  int iVar3;
  mode_t mVar4;
  wchar_t wVar5;
  time_t tVar6;
  long lVar7;
  char *pcVar8;
  int64_t iVar9;
  ssize_t sVar10;
  longlong lVar11;
  char *pcVar12;
  archive_entry *ae;
  char filedata [64];
  archive_entry *local_90;
  uint local_88;
  int local_84;
  archive *local_80;
  undefined1 local_78 [72];
  
  iVar3 = archive_read_next_header(a,&local_90);
  local_80 = a;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ę',0,"ARCHIVE_OK",(long)iVar3,"archive_read_next_header(a, &ae)",a);
  tVar6 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ě',1,"1",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  lVar7 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ĝ',0,"0",lVar7,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar6 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ĝ',0,"0",tVar6,"archive_entry_atime(ae)",(void *)0x0);
  tVar6 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ğ',0,"0",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar8 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'ğ',"file","\"file\"",pcVar8,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  local_88 = improved_streaming | seeking;
  local_84 = seeking;
  if (local_88 != 0) {
    mVar4 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ġ',0x81ed,"AE_IFREG | 0755",(ulong)mVar4,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  iVar9 = archive_entry_size(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ģ',8,"8",iVar9,"archive_entry_size(ae)",(void *)0x0);
  wVar5 = archive_entry_size_is_set(local_90);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'Ĥ',wVar5,"archive_entry_size_is_set(ae)",(void *)0x0);
  paVar2 = local_80;
  sVar10 = archive_read_data(local_80,local_78,0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ħ',8,"8",sVar10,"archive_read_data(a, filedata, sizeof(filedata))",paVar2)
  ;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ħ',local_78,"filedata","12345678","\"12345678\"",8,"8",(void *)0x0);
  iVar3 = archive_read_next_header(paVar2,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ī',0,"ARCHIVE_OK",(long)iVar3,"archive_read_next_header(a, &ae)",paVar2);
  tVar6 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ĭ',1,"1",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  lVar7 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ĭ',0,"0",lVar7,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar6 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Į',0,"0",tVar6,"archive_entry_atime(ae)",(void *)0x0);
  tVar6 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'į',0,"0",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar8 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'İ',"file2","\"file2\"",pcVar8,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  if (local_88 != 0) {
    mVar4 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ĳ',0x81ed,"AE_IFREG | 0755",(ulong)mVar4,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  iVar9 = archive_entry_size(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ĵ',4,"4",iVar9,"archive_entry_size(ae)",(void *)0x0);
  wVar5 = archive_entry_size_is_set(local_90);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'ĵ',wVar5,"archive_entry_size_is_set(ae)",(void *)0x0);
  paVar2 = local_80;
  sVar10 = archive_read_data(local_80,local_78,0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ķ',4,"4",sVar10,"archive_read_data(a, filedata, sizeof(filedata))",paVar2)
  ;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ĸ',local_78,"filedata","1234","\"1234\"",4,"4",(void *)0x0);
  iVar3 = archive_read_next_header(paVar2,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ļ',0,"ARCHIVE_OK",(long)iVar3,"archive_read_next_header(a, &ae)",paVar2);
  tVar6 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ļ',2,"2",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  lVar7 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ľ',0,"0",lVar7,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar6 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ľ',0,"0",tVar6,"archive_entry_atime(ae)",(void *)0x0);
  tVar6 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ŀ',0,"0",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar8 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'ŀ',"file3","\"file3\"",pcVar8,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  if (local_88 != 0) {
    mVar4 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ł',0x8191,"AE_IFREG | 0621",(ulong)mVar4,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  if (local_84 == 0) {
    wVar5 = archive_entry_size_is_set(local_90);
    iVar9 = (int64_t)wVar5;
    pcVar8 = "e + 0";
    pcVar12 = "archive_entry_size_is_set(ae)";
    wVar5 = L'Ň';
    lVar11 = 0;
  }
  else {
    iVar9 = archive_entry_size(local_90);
    pcVar8 = "t + 5";
    pcVar12 = "archive_entry_size(ae)";
    lVar11 = 5;
    wVar5 = L'Ņ';
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,wVar5,lVar11,pcVar8 + 4,iVar9,pcVar12,(void *)0x0);
  sVar10 = archive_read_data(paVar2,local_78,0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ŋ',5,"5",sVar10,"archive_read_data(a, filedata, sizeof(filedata))",paVar2)
  ;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ŋ',local_78,"filedata","mnopq","\"mnopq\"",5,"5",(void *)0x0);
  iVar3 = archive_read_next_header(paVar2,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ŏ',0,"ARCHIVE_OK",(long)iVar3,"archive_read_next_header(a, &ae)",paVar2);
  tVar6 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ŏ',1,"1",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  lVar7 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ő',0,"0",lVar7,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar6 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ő',0,"0",tVar6,"archive_entry_atime(ae)",(void *)0x0);
  tVar6 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Œ',0,"0",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar8 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'œ',"symlink","\"symlink\"",pcVar8,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar4 = archive_entry_mode(local_90);
  uVar1 = local_88;
  if (local_88 == 0) {
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ś',0x81b4,"AE_IFREG | 0664",(ulong)mVar4,"archive_entry_mode(ae)",
                        (void *)0x0);
    iVar9 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ŝ',5,"5",iVar9,"archive_entry_size(ae)",(void *)0x0);
    wVar5 = archive_entry_size_is_set(local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                     ,L'ŝ',wVar5,"archive_entry_size_is_set(ae)",(void *)0x0);
  }
  else {
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ŕ',0xa1ed,"AE_IFLNK | 0755",(ulong)mVar4,"archive_entry_mode(ae)",
                        (void *)0x0);
    iVar9 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ŗ',0,"0",iVar9,"archive_entry_size(ae)",(void *)0x0);
    pcVar8 = archive_entry_symlink(local_90);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
               ,L'ŗ',"file1","\"file1\"",pcVar8,"archive_entry_symlink(ae)",(void *)0x0,L'\0');
  }
  iVar3 = archive_read_next_header(paVar2,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'š',0,"ARCHIVE_OK",(long)iVar3,"archive_read_next_header(a, &ae)",paVar2);
  tVar6 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ţ',0xb,"11",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  lVar7 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ţ',0,"0",lVar7,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar6 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ť',0,"0",tVar6,"archive_entry_atime(ae)",(void *)0x0);
  tVar6 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ť',0,"0",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar8 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'Ŧ',"dir/","\"dir/\"",pcVar8,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  if (uVar1 != 0) {
    mVar4 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ũ',0x41ed,"AE_IFDIR | 0755",(ulong)mVar4,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  iVar9 = archive_entry_size(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ũ',0,"0",iVar9,"archive_entry_size(ae)",(void *)0x0);
  wVar5 = archive_entry_size_is_set(local_90);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'Ū',wVar5,"archive_entry_size_is_set(ae)",(void *)0x0);
  sVar10 = archive_read_data(paVar2,local_78,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ū',0,"0",sVar10,"archive_read_data(a, filedata, 10)",paVar2);
  iVar3 = archive_read_next_header(paVar2,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ų',0,"ARCHIVE_OK",(long)iVar3,"archive_read_next_header(a, &ae)",paVar2);
  tVar6 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ŵ',1,"1",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  lVar7 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ŷ',0,"0",lVar7,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar6 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ŷ',0,"0",tVar6,"archive_entry_atime(ae)",(void *)0x0);
  tVar6 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ÿ',0,"0",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar8 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'Ź',"file_deflate","\"file_deflate\"",pcVar8,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  if (uVar1 != 0) {
    mVar4 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ż',0x81ed,"AE_IFREG | 0755",(ulong)mVar4,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  iVar9 = archive_entry_size(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ž',8,"8",iVar9,"archive_entry_size(ae)",(void *)0x0);
  wVar5 = archive_entry_size_is_set(local_90);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'ž',wVar5,"archive_entry_size_is_set(ae)",(void *)0x0);
  sVar10 = archive_read_data(paVar2,local_78,0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ƀ',8,"8",sVar10,"archive_read_data(a, filedata, sizeof(filedata))",paVar2)
  ;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ɓ',local_78,"filedata","12345678","\"12345678\"",8,"8",(void *)0x0);
  iVar3 = archive_read_next_header(paVar2,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ƅ',0,"ARCHIVE_OK",(long)iVar3,"archive_read_next_header(a, &ae)",paVar2);
  tVar6 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ɔ',1,"1",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  lVar7 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ƈ',0,"0",lVar7,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar6 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ƈ',0,"0",tVar6,"archive_entry_atime(ae)",(void *)0x0);
  tVar6 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ɖ',0,"0",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar8 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'Ɗ',"file2_deflate","\"file2_deflate\"",pcVar8,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  if (local_88 != 0) {
    mVar4 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ƌ',0x81ed,"AE_IFREG | 0755",(ulong)mVar4,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  iVar9 = archive_entry_size(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ǝ',4,"4",iVar9,"archive_entry_size(ae)",(void *)0x0);
  wVar5 = archive_entry_size_is_set(local_90);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'Ə',wVar5,"archive_entry_size_is_set(ae)",(void *)0x0);
  sVar10 = archive_read_data(paVar2,local_78,0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ƒ',4,"4",sVar10,"archive_read_data(a, filedata, sizeof(filedata))",paVar2)
  ;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ƒ',local_78,"filedata","1234","\"1234\"",4,"4",(void *)0x0);
  iVar3 = archive_read_next_header(paVar2,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ƕ',0,"ARCHIVE_OK",(long)iVar3,"archive_read_next_header(a, &ae)",paVar2);
  tVar6 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ɩ',2,"2",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  lVar7 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ɨ',0,"0",lVar7,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar6 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ƙ',0,"0",tVar6,"archive_entry_atime(ae)",(void *)0x0);
  tVar6 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ƙ',0,"0",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar8 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'ƚ',"file3_deflate","\"file3_deflate\"",pcVar8,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  if (local_88 != 0) {
    mVar4 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ɯ',0x8191,"AE_IFREG | 0621",(ulong)mVar4,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  if (local_84 == 0) {
    wVar5 = archive_entry_size_is_set(local_90);
    iVar9 = (int64_t)wVar5;
    pcVar8 = "e + 0";
    pcVar12 = "archive_entry_size_is_set(ae)";
    wVar5 = L'ơ';
    lVar11 = 0;
  }
  else {
    iVar9 = archive_entry_size(local_90);
    pcVar8 = "t + 5";
    pcVar12 = "archive_entry_size(ae)";
    lVar11 = 5;
    wVar5 = L'Ɵ';
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,wVar5,lVar11,pcVar8 + 4,iVar9,pcVar12,(void *)0x0);
  sVar10 = archive_read_data(paVar2,local_78,0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ƥ',5,"5",sVar10,"archive_read_data(a, filedata, sizeof(filedata))",paVar2)
  ;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ƥ',local_78,"filedata","ghijk","\"ghijk\"",4,"4",(void *)0x0);
  iVar3 = archive_read_next_header(paVar2,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ƨ',0,"ARCHIVE_OK",(long)iVar3,"archive_read_next_header(a, &ae)",paVar2);
  tVar6 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ʃ',1,"1",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  lVar7 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ƪ',0,"0",lVar7,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar6 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ƫ',0,"0",tVar6,"archive_entry_atime(ae)",(void *)0x0);
  tVar6 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ƭ',0,"0",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar8 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'ƭ',"symlink_deflate","\"symlink_deflate\"",pcVar8,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  mVar4 = archive_entry_mode(local_90);
  if (local_88 == 0) {
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ƴ',0x81b4,"AE_IFREG | 0664",(ulong)mVar4,"archive_entry_mode(ae)",
                        (void *)0x0);
    iVar9 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ƴ',5,"5",iVar9,"archive_entry_size(ae)",(void *)0x0);
    sVar10 = archive_read_data(paVar2,local_78,10);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ƶ',5,"5",sVar10,"archive_read_data(a, filedata, 10)",paVar2);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ƶ',local_78,"filedata","file1","\"file1\"",5,"5",(void *)0x0);
  }
  else {
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ư',0xa1ed,"AE_IFLNK | 0755",(ulong)mVar4,"archive_entry_mode(ae)",
                        (void *)0x0);
    iVar9 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ư',0,"0",iVar9,"archive_entry_size(ae)",(void *)0x0);
    pcVar8 = archive_entry_symlink(local_90);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
               ,L'Ʊ',"file1","\"file1\"",pcVar8,"archive_entry_symlink(ae)",(void *)0x0,L'\0');
  }
  iVar3 = archive_read_next_header(paVar2,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ƺ',0,"ARCHIVE_OK",(long)iVar3,"archive_read_next_header(a, &ae)",paVar2);
  tVar6 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ƻ',0xb,"11",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  lVar7 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ƽ',0,"0",lVar7,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar6 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ƽ',0,"0",tVar6,"archive_entry_atime(ae)",(void *)0x0);
  tVar6 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ƾ',0,"0",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar8 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'ƿ',"dir_deflate/","\"dir_deflate/\"",pcVar8,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  if (local_84 != 0) {
    mVar4 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ǁ',0x41ed,"AE_IFDIR | 0755",(ulong)mVar4,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  iVar9 = archive_entry_size(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ǃ',0,"0",iVar9,"archive_entry_size(ae)",(void *)0x0);
  wVar5 = archive_entry_size_is_set(local_90);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'Ǆ',wVar5,"archive_entry_size_is_set(ae)",(void *)0x0);
  sVar10 = archive_read_data(paVar2,local_78,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ǅ',0,"0",sVar10,"archive_read_data(a, filedata, 10)",paVar2);
  iVar3 = archive_read_next_header(paVar2,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ǎ',0,"ARCHIVE_OK",(long)iVar3,"archive_read_next_header(a, &ae)",paVar2);
  tVar6 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ǎ',1,"1",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  lVar7 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ǐ',0,"0",lVar7,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar6 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ǒ',0,"0",tVar6,"archive_entry_atime(ae)",(void *)0x0);
  tVar6 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ǒ',0,"0",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar8 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'Ǔ',"file_stored","\"file_stored\"",pcVar8,"archive_entry_pathname(ae)",(void *)0x0,
             L'\0');
  if (local_88 != 0) {
    mVar4 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ǖ',0x81ed,"AE_IFREG | 0755",(ulong)mVar4,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  wVar5 = archive_entry_size_is_set(local_90);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'Ǘ',wVar5,"archive_entry_size_is_set(ae)",(void *)0x0);
  wVar5 = archive_entry_size_is_set(local_90);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'ǘ',wVar5,"archive_entry_size_is_set(ae)",(void *)0x0);
  iVar9 = archive_entry_size(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ǚ',8,"8",iVar9,"archive_entry_size(ae)",(void *)0x0);
  sVar10 = archive_read_data(paVar2,local_78,0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ǜ',8,"8",sVar10,"archive_read_data(a, filedata, sizeof(filedata))",paVar2)
  ;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ǜ',local_78,"filedata","12345678","\"12345678\"",8,"8",(void *)0x0);
  iVar3 = archive_read_next_header(paVar2,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ǡ',0,"ARCHIVE_OK",(long)iVar3,"archive_read_next_header(a, &ae)",paVar2);
  tVar6 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ǡ',1,"1",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  lVar7 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ǣ',0,"0",lVar7,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar6 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ǣ',0,"0",tVar6,"archive_entry_atime(ae)",(void *)0x0);
  tVar6 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ǥ',0,"0",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar8 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'ǥ',"file2_stored","\"file2_stored\"",pcVar8,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  if (local_88 != 0) {
    mVar4 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ǧ',0x81ed,"AE_IFREG | 0755",(ulong)mVar4,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  iVar9 = archive_entry_size(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ǩ',4,"4",iVar9,"archive_entry_size(ae)",(void *)0x0);
  wVar5 = archive_entry_size_is_set(local_90);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'Ǫ',wVar5,"archive_entry_size_is_set(ae)",(void *)0x0);
  sVar10 = archive_read_data(paVar2,local_78,0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ǭ',4,"4",sVar10,"archive_read_data(a, filedata, sizeof(filedata))",paVar2)
  ;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ǭ',local_78,"filedata","ACEG","\"ACEG\"",4,"4",(void *)0x0);
  iVar3 = archive_read_next_header(paVar2,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ǰ',0,"ARCHIVE_OK",(long)iVar3,"archive_read_next_header(a, &ae)",paVar2);
  tVar6 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ǳ',2,"2",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  lVar7 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ǲ',0,"0",lVar7,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar6 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ǳ',0,"0",tVar6,"archive_entry_atime(ae)",(void *)0x0);
  tVar6 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ǵ',0,"0",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar8 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'ǵ',"file3_stored","\"file3_stored\"",pcVar8,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  if (local_88 != 0) {
    mVar4 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ƿ',0x8191,"AE_IFREG | 0621",(ulong)mVar4,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  if (local_84 == 0) {
    wVar5 = archive_entry_size_is_set(local_90);
    iVar9 = (int64_t)wVar5;
    pcVar8 = "e + 0";
    pcVar12 = "archive_entry_size_is_set(ae)";
    wVar5 = L'ǻ';
    lVar11 = 0;
  }
  else {
    iVar9 = archive_entry_size(local_90);
    pcVar8 = "t + 5";
    pcVar12 = "archive_entry_size(ae)";
    lVar11 = 5;
    wVar5 = L'ǹ';
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,wVar5,lVar11,pcVar8 + 4,iVar9,pcVar12,(void *)0x0);
  sVar10 = archive_read_data(paVar2,local_78,0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ǿ',5,"5",sVar10,"archive_read_data(a, filedata, sizeof(filedata))",paVar2)
  ;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ǿ',local_78,"filedata","ijklm","\"ijklm\"",4,"4",(void *)0x0);
  iVar3 = archive_read_next_header(paVar2,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ȃ',0,"ARCHIVE_OK",(long)iVar3,"archive_read_next_header(a, &ae)",paVar2);
  tVar6 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ȃ',1,"1",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  lVar7 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ȅ',0,"0",lVar7,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar6 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ȅ',0,"0",tVar6,"archive_entry_atime(ae)",(void *)0x0);
  tVar6 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ȇ',0,"0",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar8 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'ȇ',"symlink_stored","\"symlink_stored\"",pcVar8,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  mVar4 = archive_entry_mode(local_90);
  uVar1 = local_88;
  if (local_88 == 0) {
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ȍ',0x81b4,"AE_IFREG | 0664",(ulong)mVar4,"archive_entry_mode(ae)",
                        (void *)0x0);
    iVar9 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ȏ',5,"5",iVar9,"archive_entry_size(ae)",(void *)0x0);
    sVar10 = archive_read_data(paVar2,local_78,10);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ȏ',5,"5",sVar10,"archive_read_data(a, filedata, 10)",paVar2);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ȑ',local_78,"filedata","file1","\"file1\"",5,"5",(void *)0x0);
  }
  else {
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ȉ',0xa1ed,"AE_IFLNK | 0755",(ulong)mVar4,"archive_entry_mode(ae)",
                        (void *)0x0);
    iVar9 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ȋ',0,"0",iVar9,"archive_entry_size(ae)",(void *)0x0);
    pcVar8 = archive_entry_symlink(local_90);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
               ,L'ȋ',"file1","\"file1\"",pcVar8,"archive_entry_symlink(ae)",(void *)0x0,L'\0');
  }
  iVar3 = archive_read_next_header(paVar2,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ȕ',0,"ARCHIVE_OK",(long)iVar3,"archive_read_next_header(a, &ae)",paVar2);
  tVar6 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ȕ',0xb,"11",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  lVar7 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ȗ',0,"0",lVar7,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar6 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ȗ',0,"0",tVar6,"archive_entry_atime(ae)",(void *)0x0);
  tVar6 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ș',0,"0",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar8 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'ș',"dir_stored/","\"dir_stored/\"",pcVar8,"archive_entry_pathname(ae)",(void *)0x0,
             L'\0');
  if (uVar1 != 0) {
    mVar4 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ț',0x41ed,"AE_IFDIR | 0755",(ulong)mVar4,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  iVar9 = archive_entry_size(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ȝ',0,"0",iVar9,"archive_entry_size(ae)",(void *)0x0);
  sVar10 = archive_read_data(paVar2,local_78,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ȝ',0,"0",sVar10,"archive_read_data(a, filedata, 10)",paVar2);
  iVar3 = archive_read_next_header(paVar2,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ƞ',1,"ARCHIVE_EOF",(long)iVar3,"archive_read_next_header(a, &ae)",paVar2);
  iVar3 = archive_read_close(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ȡ',0,"ARCHIVE_OK",(long)iVar3,"archive_read_close(a)",(void *)0x0);
  iVar3 = archive_read_free(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ȣ',0,"ARCHIVE_OK",(long)iVar3,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
verify_contents(struct archive *a, int seeking, int improved_streaming)
{
	char filedata[64];
	struct archive_entry *ae;

	/*
	 * Default compression options:
	 */

	/* Read and verify first file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	/* Zip doesn't store high-resolution mtime. */
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
	}
	assertEqualInt(8, archive_entry_size(ae));
	assert(archive_entry_size_is_set(ae));
	assertEqualIntA(a, 8,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "12345678", 8);


	/* Read the second file back. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file2", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
	}
	assertEqualInt(4, archive_entry_size(ae));
	assert(archive_entry_size_is_set(ae));
	assertEqualIntA(a, 4,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "1234", 4);

	/* Read the third file back. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file3", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFREG | 0621, archive_entry_mode(ae));
	}
	if (seeking) {
		assertEqualInt(5, archive_entry_size(ae));
	} else {
		assertEqualInt(0, archive_entry_size_is_set(ae));
	}
	assertEqualIntA(a, 5,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "mnopq", 5);

	/* Read symlink. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("symlink", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFLNK | 0755, archive_entry_mode(ae));
		assertEqualInt(0, archive_entry_size(ae));
		assertEqualString("file1", archive_entry_symlink(ae));
	} else {
		/* Streaming cannot read file type, so
		 * symlink body shows as regular file contents. */
		assertEqualInt(AE_IFREG | 0664, archive_entry_mode(ae));
		assertEqualInt(5, archive_entry_size(ae));
		assert(archive_entry_size_is_set(ae));
	}

	/* Read the dir entry back. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(11, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("dir/", archive_entry_pathname(ae));
	if (seeking || improved_streaming)
		assertEqualInt(AE_IFDIR | 0755, archive_entry_mode(ae));
	assertEqualInt(0, archive_entry_size(ae));
	assert(archive_entry_size_is_set(ae));
	assertEqualIntA(a, 0, archive_read_data(a, filedata, 10));

#ifdef HAVE_ZLIB_H
	/*
	 * Deflate compression option:
	 */

	/* Read and verify first file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	/* Zip doesn't store high-resolution mtime. */
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file_deflate", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
	}
	assertEqualInt(8, archive_entry_size(ae));
	assert(archive_entry_size_is_set(ae));
	assertEqualIntA(a, 8,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "12345678", 8);


	/* Read the second file back. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file2_deflate", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
	}
	assertEqualInt(4, archive_entry_size(ae));
	assert(archive_entry_size_is_set(ae));
	assertEqualIntA(a, 4,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "1234", 4);

	/* Read the third file back. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file3_deflate", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFREG | 0621, archive_entry_mode(ae));
	}
	if (seeking) {
		assertEqualInt(5, archive_entry_size(ae));
	} else {
		assertEqualInt(0, archive_entry_size_is_set(ae));
	}
	assertEqualIntA(a, 5,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "ghijk", 4);

	/* Read symlink. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("symlink_deflate", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFLNK | 0755, archive_entry_mode(ae));
		assertEqualInt(0, archive_entry_size(ae));
		assertEqualString("file1", archive_entry_symlink(ae));
	} else {
		assertEqualInt(AE_IFREG | 0664, archive_entry_mode(ae));
		assertEqualInt(5, archive_entry_size(ae));
		assertEqualIntA(a, 5, archive_read_data(a, filedata, 10));
		assertEqualMem(filedata, "file1", 5);
	}

	/* Read the dir entry back. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(11, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("dir_deflate/", archive_entry_pathname(ae));
	if (seeking) {
		assertEqualInt(AE_IFDIR | 0755, archive_entry_mode(ae));
	}
	assertEqualInt(0, archive_entry_size(ae));
	assert(archive_entry_size_is_set(ae));
	assertEqualIntA(a, 0, archive_read_data(a, filedata, 10));
#endif

	/*
	 * Store compression option:
	 */

	/* Read and verify first file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	/* Zip doesn't store high-resolution mtime. */
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file_stored", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
	}
	assert(archive_entry_size_is_set(ae));
	assert(archive_entry_size_is_set(ae));
	assertEqualInt(8, archive_entry_size(ae));
	assertEqualIntA(a, 8,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "12345678", 8);


	/* Read the second file back. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file2_stored", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
	}
	assertEqualInt(4, archive_entry_size(ae));
	assert(archive_entry_size_is_set(ae));
	assertEqualIntA(a, 4,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "ACEG", 4);

	/* Read the third file back. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file3_stored", archive_entry_pathname(ae));
	if (seeking || improved_streaming)
		assertEqualInt(AE_IFREG | 0621, archive_entry_mode(ae));
	if (seeking) {
		assertEqualInt(5, archive_entry_size(ae));
	} else {
		assertEqualInt(0, archive_entry_size_is_set(ae));
	}
	assertEqualIntA(a, 5,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "ijklm", 4);

	/* Read symlink. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("symlink_stored", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFLNK | 0755, archive_entry_mode(ae));
		assertEqualInt(0, archive_entry_size(ae));
		assertEqualString("file1", archive_entry_symlink(ae));
	} else {
		assertEqualInt(AE_IFREG | 0664, archive_entry_mode(ae));
		assertEqualInt(5, archive_entry_size(ae));
		assertEqualIntA(a, 5, archive_read_data(a, filedata, 10));
		assertEqualMem(filedata, "file1", 5);
	}

	/* Read the dir entry back. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(11, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("dir_stored/", archive_entry_pathname(ae));
	if (seeking || improved_streaming)
		assertEqualInt(AE_IFDIR | 0755, archive_entry_mode(ae));
	assertEqualInt(0, archive_entry_size(ae));
	assertEqualIntA(a, 0, archive_read_data(a, filedata, 10));

	/* Verify the end of the archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}